

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Mtbdd __thiscall sylvan::Mtbdd::Abstract(Mtbdd *this,BddSet *variables,mtbdd_abstract_op op)

{
  MTBDD MVar1;
  mtbdd_abstract_op in_RCX;
  
  MVar1 = mtbdd_abstract_RUN((variables->set).bdd,*(MTBDD *)op,in_RCX);
  this->mtbdd = MVar1;
  mtbdd_protect(&this->mtbdd);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::Abstract(const BddSet &variables, mtbdd_abstract_op op) const
{
    return mtbdd_abstract(mtbdd, variables.set.bdd, op);
}